

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

size_t cppwinrt::get_fastabi_size
                 (writer *w,
                 vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *classes)

{
  pointer pTVar1;
  size_t sVar2;
  TypeDef *type;
  pointer type_00;
  ulong uVar3;
  
  pTVar1 = (classes->
           super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (type_00 = (classes->
                 super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                 )._M_impl.super__Vector_impl_data._M_start; type_00 != pTVar1;
      type_00 = type_00 + 1) {
    sVar2 = get_fastabi_size(w,type_00);
    if (uVar3 <= sVar2) {
      uVar3 = sVar2;
    }
  }
  return uVar3;
}

Assistant:

auto get_fastabi_size(writer& w, std::vector<TypeDef> const& classes)
    {
        std::size_t result{};

        for (auto&& type : classes)
        {
            result = (std::max)(result, get_fastabi_size(w, type));
        }

        return result;
    }